

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O3

void __thiscall mpt::slice::slice(slice *this,slice *from)

{
  uintptr_t uVar1;
  long lVar2;
  content *pcVar3;
  content *pcVar4;
  
  array::array(&this->super_array,&from->super_array);
  this->_off = 0;
  this->_len = 0;
  pcVar4 = (from->super_array)._buf._ref;
  pcVar3 = (this->super_array)._buf._ref;
  if (pcVar4 != pcVar3) {
    if (pcVar4 == (content *)0x0) {
      pcVar4 = (content *)0x0;
    }
    else {
      lVar2 = (**(code **)(*(long *)pcVar4 + 0x10))(pcVar4);
      if (lVar2 == 0) {
        pcVar4 = (content *)0x0;
      }
      pcVar3 = (this->super_array)._buf._ref;
    }
    if (pcVar3 != (content *)0x0) {
      (**(code **)(*(long *)pcVar3 + 8))();
    }
    (this->super_array)._buf._ref = pcVar4;
  }
  if (pcVar4 != (content *)0x0) {
    uVar1 = from->_len;
    this->_off = from->_off;
    this->_len = uVar1;
  }
  return;
}

Assistant:

slice::slice(slice const& from) : array(from), _off(0), _len(0)
{
	_buf = from._buf;
	if (!_buf.instance()) {
		return;
	}
	_len = from._len;
	_off = from._off;
}